

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>>
          (String *__return_storage_ptr__,_ *this,FixedArray<char,_1UL> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          CappedArray<char,_8UL> *params_3)

{
  size_t sVar1;
  _ *p_Var2;
  
  heapString(__return_storage_ptr__,
             (size_t)(params_2->ptr + params_1->size_ + 1 + *(long *)(params + 8)));
  p_Var2 = (_ *)(__return_storage_ptr__->content).size_;
  if (p_Var2 != (_ *)0x0) {
    p_Var2 = (_ *)(__return_storage_ptr__->content).ptr;
  }
  *p_Var2 = *this;
  p_Var2 = p_Var2 + 1;
  sVar1 = *(size_t *)(params + 8);
  if (sVar1 != 0) {
    memcpy(p_Var2,*(void **)params,sVar1);
    p_Var2 = p_Var2 + sVar1;
  }
  sVar1 = params_1->size_;
  if (sVar1 != 0) {
    memcpy(p_Var2,params_1->ptr,sVar1);
    p_Var2 = p_Var2 + sVar1;
  }
  if (params_2->ptr != (char *)0x0) {
    memcpy(p_Var2,&params_2->size_,(size_t)params_2->ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}